

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_draw.c
# Opt level: O1

int main(int argc,char **argv)

{
  ALLEGRO_COLOR AVar1;
  ALLEGRO_BITMAP *pAVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  ALLEGRO_EVENT_QUEUE *pAVar14;
  undefined8 uVar15;
  char *in_RCX;
  float *pfVar16;
  bool bVar17;
  long unaff_RBX;
  code *pcVar18;
  ulong uVar19;
  ulong uVar20;
  undefined4 in_XMM1_Da;
  float fVar21;
  float fVar22;
  float in_XMM1_Db;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  ALLEGRO_COLOR color;
  int cx;
  int ch;
  int cw;
  int cy;
  uchar g;
  uchar r;
  char str [256];
  undefined8 uStack_bf0;
  uint *puStack_be8;
  undefined1 *puStack_be0;
  undefined1 auStack_bd0 [8];
  code *pcStack_bc8;
  char *pcStack_bb8;
  char acStack_b20 [1032];
  undefined1 auStack_718 [1024];
  long lStack_318;
  uint local_2f0;
  undefined1 local_2ec [4];
  float local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined8 local_2d8;
  float local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined8 local_2b8;
  ALLEGRO_BITMAP *local_2a8;
  long local_2a0;
  ulong local_298;
  undefined1 local_28c [4];
  undefined1 local_288 [4];
  undefined1 local_284 [4];
  int local_280 [8];
  int local_260;
  float afStack_244 [3];
  float local_238 [64];
  char local_138 [264];
  
  pcVar18 = atexit;
  cVar3 = al_install_system(0x5020700);
  if (cVar3 == '\0') {
    pcVar8 = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    al_init_image_addon();
    al_init_font_addon();
    ex.samples = 0;
    unaff_RBX = al_load_config_file("ex_draw.ini");
    if (unaff_RBX == 0) {
      unaff_RBX = al_create_config();
    }
    pcVar8 = (char *)al_get_config_value(unaff_RBX,"settings","samples");
    if (pcVar8 != (char *)0x0) {
      lVar9 = strtol(pcVar8,(char **)0x0,0);
      ex.samples = (int)lVar9;
    }
    in_RCX = local_138;
    sprintf(in_RCX,"%d",(ulong)(uint)ex.samples);
    al_set_config_value(unaff_RBX,"settings","samples");
    al_save_config_file("ex_draw.ini",unaff_RBX);
    al_destroy_config(unaff_RBX);
    if (ex.samples != 0) {
      al_set_new_display_option(0x11,1,1);
      al_set_new_display_option(0x12,ex.samples,2);
    }
    pcVar18 = (code *)0x280;
    local_2a0 = al_create_display(0x280);
    if (local_2a0 == 0) {
      pcVar8 = "Unable to create display.\n";
    }
    else {
      ex.FPS = 0x3c;
      pcVar18 = (code *)0x0;
      ex.font = (ALLEGRO_FONT *)al_load_font("data/fixed_font.tga",0,0);
      if (ex.font != (ALLEGRO_FONT *)0x0) {
        uVar13 = al_color_name("beige");
        ex.background.b = (float)in_XMM1_Da;
        ex.background.r = (float)(int)uVar13;
        ex.background.g = (float)(int)((ulong)uVar13 >> 0x20);
        ex.background.a = in_XMM1_Db;
        uVar13 = al_color_name("black");
        ex.foreground.b = (float)in_XMM1_Da;
        ex.foreground.r = (float)(int)uVar13;
        ex.foreground.g = (float)(int)((ulong)uVar13 >> 0x20);
        ex.foreground.a = in_XMM1_Db;
        uVar13 = al_color_name("red");
        ex.outline.b = (float)in_XMM1_Da;
        ex.outline.r = (float)(int)uVar13;
        ex.outline.g = (float)(int)((ulong)uVar13 >> 0x20);
        ex.outline.a = in_XMM1_Db;
        uVar13 = al_color_name("blue");
        ex.text.b = (float)in_XMM1_Da;
        ex.text.r = (float)(int)uVar13;
        ex.text.g = (float)(int)((ulong)uVar13 >> 0x20);
        ex.text.a = in_XMM1_Db;
        uVar13 = al_color_name("white");
        ex.white.b = (float)in_XMM1_Da;
        ex.white.r = (float)(int)uVar13;
        ex.white.g = (float)(int)((ulong)uVar13 >> 0x20);
        ex.white.a = in_XMM1_Db;
        ex.pattern = (ALLEGRO_BITMAP *)al_create_bitmap(0x20,0x20);
        ex.zoom = (ALLEGRO_BITMAP *)al_create_bitmap(0x20,0x20);
        pAVar2 = ex.pattern;
        local_2f0 = al_get_bitmap_width(ex.pattern);
        uVar4 = al_get_bitmap_height(pAVar2);
        fVar21 = 1.0;
        uVar23 = 0;
        uVar25 = 0;
        uVar27 = 0;
        local_2b8 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        fVar22 = 0.9;
        uVar24 = 0;
        uVar26 = 0;
        uVar28 = 0;
        local_2c8 = fVar21;
        uStack_2c4 = uVar23;
        uStack_2c0 = uVar25;
        uStack_2bc = uVar27;
        local_2d8 = al_map_rgb_f(0x3f800000,0x3f666666,0x3f4ccccd);
        local_2a8 = pAVar2;
        local_2e8 = fVar22;
        uStack_2e4 = uVar24;
        uStack_2e0 = uVar26;
        uStack_2dc = uVar28;
        plVar10 = (long *)al_lock_bitmap(pAVar2,0x13,2);
        if (0 < (int)uVar4) {
          uVar11 = (ulong)local_2f0;
          uVar19 = 0;
          local_298 = (ulong)uVar4;
          do {
            if (0 < (int)local_2f0) {
              lVar9 = 0;
              uVar20 = uVar19;
              uVar13 = local_2d8;
              do {
                local_2d8._0_4_ = (float)uVar13;
                fVar21 = local_2e8;
                if ((uVar20 & 1) != 0) {
                  local_2d8._0_4_ = (float)local_2b8;
                  fVar21 = local_2c8;
                }
                lVar12 = *plVar10;
                al_unmap_rgb((float)local_2d8,fVar21,local_238,local_280,local_2ec);
                local_2d8 = uVar13;
                lVar12 = *(int *)((long)plVar10 + 0xc) * (int)uVar19 + lVar12;
                *(undefined1 *)(lVar9 + lVar12) = local_238[0]._0_1_;
                *(undefined1 *)(lVar9 + 1 + lVar12) = (undefined1)local_280[0];
                *(undefined1 *)(lVar9 + 2 + lVar12) = local_2ec[0];
                lVar9 = lVar9 + 3;
                uVar20 = uVar20 + 1;
                uVar13 = local_2d8;
              } while (uVar11 * 3 != lVar9);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_298);
        }
        al_unlock_bitmap(local_2a8);
        uVar13 = al_create_timer(SUB84(1.0 / (double)ex.FPS,0));
        pAVar14 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
        ex.queue = pAVar14;
        uVar15 = al_get_keyboard_event_source();
        al_register_event_source(pAVar14,uVar15);
        pAVar14 = ex.queue;
        uVar15 = al_get_mouse_event_source();
        al_register_event_source(pAVar14,uVar15);
        pAVar14 = ex.queue;
        uVar15 = al_get_display_event_source(local_2a0);
        al_register_event_source(pAVar14,uVar15);
        pAVar14 = ex.queue;
        uVar15 = al_get_timer_event_source(uVar13);
        al_register_event_source(pAVar14,uVar15);
        al_start_timer(uVar13);
        bVar17 = true;
        do {
          while( true ) {
            while( true ) {
              if (bVar17) {
                cVar3 = al_is_event_queue_empty(ex.queue);
                if (cVar3 != '\0') {
                  iVar5 = al_get_bitmap_width(ex.zoom);
                  iVar6 = al_get_bitmap_height(ex.zoom);
                  uVar13 = al_get_target_bitmap();
                  iVar7 = 0;
                  pfVar16 = local_238;
                  lVar9 = 0;
                  do {
                    fVar21 = (float)iVar7 + (float)(int)lVar9 * 0.25 + 2.0;
                    fVar22 = fVar21 + 5.0;
                    pfVar16[0xc] = 23.75;
                    pfVar16[0xd] = fVar21;
                    pfVar16[0xe] = 28.75;
                    pfVar16[0xf] = fVar22;
                    pfVar16[8] = 16.5;
                    pfVar16[9] = fVar21;
                    pfVar16[10] = 21.5;
                    pfVar16[0xb] = fVar22;
                    pfVar16[4] = 9.25;
                    pfVar16[5] = fVar21;
                    pfVar16[6] = 14.25;
                    pfVar16[7] = fVar22;
                    *pfVar16 = 2.0;
                    pfVar16[1] = fVar21;
                    pfVar16[2] = 7.0;
                    pfVar16[3] = fVar22;
                    lVar9 = lVar9 + 1;
                    iVar7 = iVar7 + 7;
                    pfVar16 = pfVar16 + 0x10;
                  } while (lVar9 != 4);
                  al_get_clipping_rectangle(local_2ec,local_284,local_288,local_28c);
                  al_clear_to_color(ex.background.r);
                  ex.text_x = 8.0;
                  ex.text_y = 0.0;
                  print("Drawing %s (press SPACE to change)",names[ex.what]);
                  ex.text_x = 8.0;
                  ex.text_y = 16.0;
                  print("Original");
                  ex.text_x = 80.0;
                  ex.text_y = 16.0;
                  print("Enlarged x 16");
                  al_set_blender(0,1,0);
                  if (ex.software == true) {
                    al_set_new_bitmap_flags(1);
                    uVar15 = al_get_target_bitmap();
                    uVar23 = al_get_bitmap_format(uVar15);
                    al_set_new_bitmap_format(uVar23);
                    uVar15 = al_create_bitmap(iVar5,iVar6);
                    al_set_target_bitmap(uVar15);
                    local_2d8._0_4_ = 0.0;
                    local_2e8 = 0.0;
                  }
                  else {
                    uVar15 = 0;
                    local_2d8._0_4_ = 40.0;
                    local_2e8 = 8.0;
                  }
                  al_draw_bitmap(ex.pattern,0);
                  al_set_blender(0,1,3);
                  lVar9 = 0xc;
                  do {
                    AVar1 = ex.foreground;
                    color.a = ex.foreground.a * 0.5;
                    color.b = ex.foreground.b;
                    color.r = ex.foreground.r;
                    color.g = ex.foreground.g;
                    ex.foreground = AVar1;
                    primitive(*(float *)((long)afStack_244 + lVar9) + local_2e8,
                              *(float *)((long)afStack_244 + lVar9 + 4) + (float)local_2d8,
                              *(float *)((long)afStack_244 + lVar9 + 8) + local_2e8,
                              *(float *)((long)local_238 + lVar9) + (float)local_2d8,color,false);
                    lVar9 = lVar9 + 0x10;
                  } while (lVar9 != 0x10c);
                  al_set_blender(0,1,0);
                  if (ex.software == true) {
                    al_set_target_bitmap(uVar13);
                    al_draw_bitmap(0x41000000,0x42200000,uVar15,0);
                    al_destroy_bitmap(uVar15);
                    local_2d8._0_4_ = 40.0;
                    local_2e8 = 8.0;
                  }
                  al_set_target_bitmap(ex.zoom);
                  local_2b8._0_4_ = (float)iVar5;
                  local_2c8 = (float)iVar6;
                  al_draw_bitmap_region
                            (local_2e8,(float)local_2d8,(float)local_2b8,local_2c8,0,0,uVar13,0);
                  al_set_target_bitmap(uVar13);
                  al_draw_scaled_bitmap
                            (0,0,(float)local_2b8,local_2c8,0x42a00000,0x42200000,
                             (float)(iVar5 << 4),(float)(iVar6 << 4),ex.zoom,0);
                  lVar9 = 0xc;
                  do {
                    primitive(*(float *)((long)afStack_244 + lVar9) * 16.0 + 80.0,
                              *(float *)((long)afStack_244 + lVar9 + 4) * 16.0 + 40.0,
                              *(float *)((long)afStack_244 + lVar9 + 8) * 16.0 + 80.0,
                              *(float *)((long)local_238 + lVar9) * 16.0 + 40.0,ex.outline,true);
                    lVar9 = lVar9 + 0x10;
                  } while (lVar9 != 0x10c);
                  ex.text_x = 8.0;
                  ex.text_y = 592.0;
                  bVar17 = false;
                  print("Thickness: %d (press T to change)",(ulong)(uint)ex.thickness);
                  pcVar8 = "hardware";
                  if (ex.software != false) {
                    pcVar8 = "software";
                  }
                  print("Drawing with: %s (press S to change)",pcVar8);
                  print("Supersampling: %dx (edit ex_draw.ini to change)",(ulong)(uint)ex.samples);
                  al_flip_display();
                }
              }
              al_wait_for_event(ex.queue,local_280);
              if (local_280[0] != 10) break;
              if (local_260 < 0x3b) {
                if (local_260 == 0x13) {
                  ex.software = (_Bool)(ex.software ^ 1);
                }
                else if ((local_260 == 0x14) && (ex.thickness = ex.thickness + 1, ex.thickness == 2)
                        ) {
                  ex.thickness = 0;
                }
              }
              else if (local_260 == 0x4b) {
                ex.what = ex.what + 1;
                if (ex.what == 5) {
                  ex.what = 0;
                }
              }
              else if (local_260 == 0x3b) goto LAB_00102f5e;
            }
            if (local_280[0] != 0x1e) break;
            bVar17 = true;
          }
        } while (local_280[0] != 0x2a);
LAB_00102f5e:
        al_destroy_event_queue(ex.queue);
        return 0;
      }
      pcVar8 = "data/fixed_font.tga not found.\n";
      ex.font = (ALLEGRO_FONT *)0x0;
      unaff_RBX = local_2a0;
    }
  }
  abort_example(pcVar8);
  pcStack_bc8 = pcVar18;
  pcStack_bb8 = in_RCX;
  lStack_318 = unaff_RBX;
  iVar5 = al_get_font_line_height(ex.font);
  al_store_state(auStack_718,0x10);
  puStack_be8 = &local_2f0;
  uStack_bf0 = 0x3000000008;
  puStack_be0 = auStack_bd0;
  vsnprintf(acStack_b20,0x400,pcVar8,&uStack_bf0);
  al_set_blender(0,1,3);
  al_draw_textf(ex.text.r,ex.text.b,ex.text_x,ex.text_y,ex.font,0,"%s",acStack_b20);
  iVar6 = al_restore_state(auStack_718);
  ex.text_y = (float)iVar5 + ex.text_y;
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_CONFIG *config;
   char const *value;
   char str[256];

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();
   al_init_image_addon();
   al_init_font_addon();
   init_platform_specific();

   /* Read supersampling info from ex_draw.ini. */
   ex.samples = 0;
   config = al_load_config_file("ex_draw.ini");
   if (!config)
      config = al_create_config();
   value = al_get_config_value(config, "settings", "samples");
   if (value)
      ex.samples = strtol(value, NULL, 0);
   sprintf(str, "%d", ex.samples);
   al_set_config_value(config, "settings", "samples", str);
   al_save_config_file("ex_draw.ini", config);
   al_destroy_config(config);

   if (ex.samples) {
      al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_REQUIRE);
      al_set_new_display_option(ALLEGRO_SAMPLES, ex.samples, ALLEGRO_SUGGEST);
   }
   display = al_create_display(640, 640);
   if (!display) {
      abort_example("Unable to create display.\n");
   }

   init();

   timer = al_create_timer(1.0 / ex.FPS);

   ex.queue = al_create_event_queue();
   al_register_event_source(ex.queue, al_get_keyboard_event_source());
   al_register_event_source(ex.queue, al_get_mouse_event_source());
   al_register_event_source(ex.queue, al_get_display_event_source(display));
   al_register_event_source(ex.queue, al_get_timer_event_source(timer));

   al_start_timer(timer);
   run();

   al_destroy_event_queue(ex.queue);  

   return 0;
}